

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::BerdySparseMAPSolverPimpl
          (BerdySparseMAPSolverPimpl *this,BerdyHelper *berdyHelper)

{
  BerdyHelper *in_RSI;
  BerdySparseMAPSolverPimpl *in_RDI;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff50;
  BerdySparseMAPSolverPimpl *this_00;
  
  in_RDI->berdy = in_RSI;
  in_RDI->valid = false;
  this_00 = in_RDI;
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::VectorDynSize::VectorDynSize(&in_RDI->priorDynamicsRegularizationExpectedValue);
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::VectorDynSize::VectorDynSize(&in_RDI->dynamicsConstraintsBias);
  iDynTree::VectorDynSize::VectorDynSize(&in_RDI->measurementsBias);
  iDynTree::JointPosDoubleArray::JointPosDoubleArray(&in_RDI->jointsConfiguration,0);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray(&in_RDI->jointsVelocity,0);
  iDynTree::VectorDynSize::VectorDynSize(&in_RDI->measurements);
  iDynTree::VectorDynSize::VectorDynSize(&in_RDI->expectedDynamicsPrior);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(in_stack_ffffffffffffff50);
  iDynTree::VectorDynSize::VectorDynSize(&in_RDI->expectedDynamicsPriorRHS);
  iDynTree::VectorDynSize::VectorDynSize(&in_RDI->expectedDynamicsAPosteriori);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(in_stack_ffffffffffffff50);
  iDynTree::VectorDynSize::VectorDynSize(&in_RDI->expectedDynamicsAPosterioriRHS);
  Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
  SimplicialLDLT((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *
                 )0x5a8f8e);
  Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
  SimplicialLDLT((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *
                 )0x5a8fa9);
  initialize(this_00);
  return;
}

Assistant:

BerdySparseMAPSolverPimpl(BerdyHelper& berdyHelper)
        : berdy(berdyHelper)
        , valid(false)
        {
            initialize();
        }